

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evalfunc.c
# Opt level: O2

void func_eval(astnode *declaration_specifiers,astnode *declarator,astnode *declaration_list,
              astnode *compound_statement)

{
  puts("Evaluated function");
  return;
}

Assistant:

void func_eval	( struct astnode *declaration_specifiers
				, struct astnode *declarator
				, struct astnode *declaration_list
				, struct astnode *compound_statement)
{
	
	
	//Start function code left side is name of function
	printf("Evaluated function\n");
	
	//freenode(ptr->right);
	//free(ptr->left);
	//free(ptr);
	
	return;
	
}